

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  byte bVar1;
  int iVar2;
  int target;
  int iVar3;
  Expr *p;
  
  p = sqlite3ExprSkipCollate(pExpr);
  if (((pParse->okConstFactor != '\0') && (p->op != 0xa8)) &&
     (iVar2 = sqlite3ExprIsConstantNotJoin(p), iVar2 != 0)) {
    *pReg = 0;
    iVar2 = sqlite3ExprCodeAtInit(pParse,p,-1);
    return iVar2;
  }
  target = sqlite3GetTempReg(pParse);
  iVar3 = sqlite3ExprCodeTarget(pParse,p,target);
  iVar2 = target;
  if ((iVar3 != target) && (iVar2 = 0, target != 0)) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = target;
    }
  }
  *pReg = iVar2;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( ConstFactorOk(pParse)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeAtInit(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}